

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O1

Acec_Box_t *
Acec_FindBox(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Wec_t *vAddBoxes,Vec_Wec_t *vXorLeaves,
            Vec_Int_t *vXorRoots)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int *piVar7;
  bool bVar8;
  uint uVar9;
  Vec_Bit_t *vVisit;
  int *piVar10;
  void *__s;
  byte *__s_00;
  Acec_Box_t *pAVar11;
  Vec_Wec_t *pVVar12;
  Vec_Int_t *pVVar13;
  Vec_Wec_t *pVVar14;
  Vec_Int_t *pVVar15;
  uint uVar16;
  char *__function;
  uint uVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  char *__file;
  char *__assertion;
  long lVar21;
  uint uVar22;
  long lVar23;
  int iVar24;
  size_t __n;
  
  iVar2 = vAddBoxes->nSize;
  uVar16 = vAdds->nSize / 6;
  iVar24 = (((int)uVar16 >> 5) + 1) - (uint)((uVar16 & 0x1f) == 0);
  vVisit = (Vec_Bit_t *)malloc(0x10);
  vVisit->nSize = 0;
  vVisit->nCap = iVar24 * 0x20;
  if (iVar24 == 0) {
    piVar10 = (int *)0x0;
  }
  else {
    piVar10 = (int *)malloc((long)iVar24 * 4);
  }
  vVisit->pArray = piVar10;
  vVisit->nSize = iVar24 * 0x20;
  __s = (void *)0x0;
  memset(piVar10,0,(long)iVar24 << 2);
  iVar24 = ((p->nObjs >> 5) + 1) - (uint)((p->nObjs & 0x1fU) == 0);
  if (iVar24 != 0) {
    __s = malloc((long)iVar24 * 4);
  }
  __n = (long)iVar24 << 2;
  __s_00 = (byte *)0x0;
  memset(__s,0,__n);
  if (iVar24 != 0) {
    __s_00 = (byte *)malloc(__n);
  }
  pVVar13 = (Vec_Int_t *)0x0;
  memset(__s_00,0,__n);
  pAVar11 = (Acec_Box_t *)calloc(1,0x30);
  pAVar11->pGia = p;
  pAVar11->vAdds = vAddBoxes;
  pVVar12 = (Vec_Wec_t *)malloc(0x10);
  iVar18 = 8;
  if (6 < iVar2 - 1U) {
    iVar18 = iVar2;
  }
  pVVar12->nSize = 0;
  pVVar12->nCap = iVar18;
  if (iVar18 != 0) {
    pVVar13 = (Vec_Int_t *)calloc((long)iVar18,0x10);
  }
  pVVar12->pArray = pVVar13;
  pVVar12->nSize = iVar2;
  pAVar11->vLeafLits = pVVar12;
  pVVar14 = (Vec_Wec_t *)malloc(0x10);
  pVVar14->nSize = 0;
  pVVar14->nCap = iVar18;
  if (iVar18 == 0) {
    pVVar13 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar13 = (Vec_Int_t *)calloc((long)iVar18,0x10);
  }
  pVVar14->pArray = pVVar13;
  pVVar14->nSize = iVar2;
  pAVar11->vRootLits = pVVar14;
  if (iVar2 != vXorLeaves->nSize) {
    __assert_fail("Vec_WecSize(vAddBoxes) == Vec_WecSize(vXorLeaves)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecXor.c"
                  ,0x131,
                  "Acec_Box_t *Acec_FindBox(Gia_Man_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *)"
                 );
  }
  if (iVar2 == vXorRoots->nSize) {
    iVar18 = iVar24 * 0x20;
    iVar2 = vAddBoxes->nSize;
    if (0 < (long)iVar2) {
      pVVar13 = vAddBoxes->pArray;
      lVar20 = 0;
      do {
        if (0 < pVVar13[lVar20].nSize) {
          piVar10 = pVVar13[lVar20].pArray;
          lVar21 = 0;
          do {
            iVar3 = piVar10[lVar21];
            if (iVar3 < 0) goto LAB_0067f992;
            uVar9 = iVar3 * 6;
            uVar16 = vAdds->nSize;
            if (uVar16 == uVar9 || SBORROW4(uVar16,uVar9) != (int)(uVar16 + iVar3 * -6) < 0)
            goto LAB_0067f992;
            piVar7 = vAdds->pArray;
            uVar4 = piVar7[uVar9];
            if (((int)uVar4 < 0) || (iVar18 <= (int)uVar4)) goto LAB_0067f9ef;
            puVar1 = (uint *)((long)__s + (ulong)(uVar4 >> 5) * 4);
            *puVar1 = *puVar1 | 1 << ((byte)uVar4 & 0x1f);
            if ((int)uVar16 <= (int)(uVar9 | 1)) goto LAB_0067f992;
            uVar4 = piVar7[uVar9 | 1];
            if (((int)uVar4 < 0) || (iVar18 <= (int)uVar4)) goto LAB_0067f9ef;
            puVar1 = (uint *)((long)__s + (ulong)(uVar4 >> 5) * 4);
            *puVar1 = *puVar1 | 1 << ((byte)uVar4 & 0x1f);
            if ((int)uVar16 <= (int)(uVar9 + 2)) goto LAB_0067f992;
            uVar4 = piVar7[uVar9 + 2];
            if (((int)uVar4 < 0) || (iVar18 <= (int)uVar4)) goto LAB_0067f9ef;
            puVar1 = (uint *)((long)__s + (ulong)(uVar4 >> 5) * 4);
            *puVar1 = *puVar1 | 1 << ((byte)uVar4 & 0x1f);
            if ((int)uVar16 <= (int)(uVar9 + 3)) goto LAB_0067f992;
            uVar4 = piVar7[uVar9 + 3];
            if (((int)uVar4 < 0) || (iVar18 <= (int)uVar4)) goto LAB_0067f9ef;
            *(uint *)(__s_00 + (ulong)(uVar4 >> 5) * 4) =
                 *(uint *)(__s_00 + (ulong)(uVar4 >> 5) * 4) | 1 << ((byte)uVar4 & 0x1f);
            if ((int)uVar16 <= (int)(uVar9 + 4)) goto LAB_0067f992;
            uVar16 = piVar7[uVar9 + 4];
            if (((int)uVar16 < 0) || (iVar18 <= (int)uVar16)) goto LAB_0067f9ef;
            *(uint *)(__s_00 + (ulong)(uVar16 >> 5) * 4) =
                 *(uint *)(__s_00 + (ulong)(uVar16 >> 5) * 4) | 1 << ((byte)uVar16 & 0x1f);
            lVar21 = lVar21 + 1;
          } while (lVar21 < pVVar13[lVar20].nSize);
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != iVar2);
    }
    if (0 < vAddBoxes->nSize) {
      lVar20 = 8;
      lVar21 = 0;
      do {
        qsort(*(void **)((long)&vAddBoxes->pArray->nCap + lVar20),
              (long)*(int *)((long)vAddBoxes->pArray + lVar20 + -4),4,Vec_IntSortCompare1);
        lVar21 = lVar21 + 1;
        lVar20 = lVar20 + 0x10;
      } while (lVar21 < vAddBoxes->nSize);
    }
    pVVar13 = Acec_TreeCarryMap(p,vAdds,vAddBoxes);
    lVar20 = (long)vAddBoxes->nSize;
    if (0 < (long)vAddBoxes->nSize) {
      do {
        if (vAddBoxes->nSize < lVar20) goto LAB_0067f9d0;
        lVar21 = lVar20 + -1;
        pVVar15 = vAddBoxes->pArray;
        if (0 < pVVar15[lVar21].nSize) {
          lVar23 = 0;
          do {
            iVar2 = pVVar15[lVar21].pArray[lVar23];
            if (iVar2 < 0) goto LAB_0067f992;
            uVar16 = iVar2 * 6 + 4;
            if (vAdds->nSize <= (int)uVar16) goto LAB_0067f992;
            uVar16 = vAdds->pArray[uVar16];
            if (((int)uVar16 < 0) || (iVar18 <= (int)uVar16)) {
LAB_0067f9b1:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                            ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
            }
            if ((*(uint *)((long)__s + (ulong)(uVar16 >> 5) * 4) >> (uVar16 & 0x1f) & 1) == 0) {
              uVar9 = iVar2 * 6 + 2;
              if (vAdds->nSize <= (int)uVar9) goto LAB_0067f992;
              Acec_TreePhases_rec(p,vAdds,pVVar13,uVar16,(uint)(vAdds->pArray[uVar9] != 0),vVisit);
            }
            lVar23 = lVar23 + 1;
          } while (lVar23 < pVVar15[lVar21].nSize);
        }
        bVar8 = 1 < lVar20;
        lVar20 = lVar21;
      } while (bVar8);
    }
    Acec_TreeVerifyPhases(p,vAdds,vAddBoxes);
    Acec_TreeVerifyPhases2(p,vAdds,vAddBoxes);
    if (vVisit->pArray != (int *)0x0) {
      free(vVisit->pArray);
      vVisit->pArray = (int *)0x0;
    }
    free(vVisit);
    if (pVVar13->pArray != (int *)0x0) {
      free(pVVar13->pArray);
      pVVar13->pArray = (int *)0x0;
    }
    if (pVVar13 != (Vec_Int_t *)0x0) {
      free(pVVar13);
    }
    if (0 < iVar24) {
      *__s_00 = *__s_00 | 1;
      if (0 < vAddBoxes->nSize) {
        lVar20 = 0;
        do {
          pVVar13 = vAddBoxes->pArray;
          if (0 < pVVar13[lVar20].nSize) {
            uVar16 = (int)lVar20 + 1;
            lVar21 = 0;
            do {
              uVar4 = pVVar13[lVar20].pArray[lVar21];
              iVar2 = uVar4 * 6;
              uVar9 = uVar4 * 6 + 5;
              lVar23 = 0;
              do {
                if (((int)uVar4 < 0) || ((long)vAdds->nSize <= iVar2 + lVar23)) goto LAB_0067f992;
                uVar5 = vAdds->pArray[iVar2 + lVar23];
                if (((int)uVar5 < 0) || (iVar18 <= (int)uVar5)) goto LAB_0067f9b1;
                if ((*(uint *)(__s_00 + (ulong)(uVar5 >> 5) * 4) >> (uVar5 & 0x1f) & 1) == 0) {
                  if (((int)uVar4 < 0) || (vAdds->nSize <= (int)uVar9)) goto LAB_0067f992;
                  uVar6 = vAdds->pArray[uVar9];
                  if (pVVar12->nSize <= lVar20) {
                    uVar17 = pVVar12->nSize * 2;
                    if ((int)uVar17 <= (int)uVar16) {
                      uVar17 = uVar16;
                    }
                    if (pVVar12->nCap < (int)uVar17) {
                      if (pVVar12->pArray == (Vec_Int_t *)0x0) {
                        pVVar15 = (Vec_Int_t *)malloc((ulong)uVar17 << 4);
                      }
                      else {
                        pVVar15 = (Vec_Int_t *)realloc(pVVar12->pArray,(ulong)uVar17 << 4);
                      }
                      pVVar12->pArray = pVVar15;
                      memset(pVVar15 + pVVar12->nCap,0,
                             ((long)(int)uVar17 - (long)pVVar12->nCap) * 0x10);
                      pVVar12->nCap = uVar17;
                    }
                    pVVar12->nSize = uVar16;
                  }
                  if (pVVar12->nSize <= lVar20) goto LAB_0067f9d0;
                  Vec_IntPush(pVVar12->pArray + lVar20,
                              (uint)((uVar6 >> ((byte)((byte)lVar23 | 0x10) & 0x1f) & 1) != 0) +
                              uVar5 * 2);
                }
                lVar23 = lVar23 + 1;
              } while (lVar23 != 3);
              uVar9 = uVar4 * 6 + 5;
              lVar23 = 3;
              do {
                if ((iVar2 + 3 < 0) || ((long)vAdds->nSize <= (long)((ulong)(uVar4 * 6) + lVar23)))
                goto LAB_0067f992;
                uVar5 = vAdds->pArray[(ulong)(uVar4 * 6) + lVar23];
                if (((int)uVar5 < 0) || (iVar18 <= (int)uVar5)) goto LAB_0067f9b1;
                if ((*(uint *)((long)__s + (ulong)(uVar5 >> 5) * 4) >> (uVar5 & 0x1f) & 1) == 0) {
                  if (vAdds->nSize <= (int)uVar9) goto LAB_0067f992;
                  uVar17 = (uint)(lVar23 == 4) + (int)lVar20;
                  uVar6 = vAdds->pArray[uVar9];
                  if (pVVar14->nSize <= (int)uVar17) {
                    uVar22 = uVar17 + 1;
                    uVar19 = pVVar14->nSize * 2;
                    if ((int)uVar19 <= (int)uVar22) {
                      uVar19 = uVar22;
                    }
                    if (pVVar14->nCap < (int)uVar19) {
                      if (pVVar14->pArray == (Vec_Int_t *)0x0) {
                        pVVar15 = (Vec_Int_t *)malloc((ulong)uVar19 << 4);
                      }
                      else {
                        pVVar15 = (Vec_Int_t *)realloc(pVVar14->pArray,(ulong)uVar19 << 4);
                      }
                      pVVar14->pArray = pVVar15;
                      memset(pVVar15 + pVVar14->nCap,0,
                             ((long)(int)uVar19 - (long)pVVar14->nCap) * 0x10);
                      pVVar14->nCap = uVar19;
                    }
                    pVVar14->nSize = uVar22;
                  }
                  if (pVVar14->nSize <= (int)uVar17) goto LAB_0067f9d0;
                  Vec_IntPush(pVVar14->pArray + uVar17,
                              (uint)((uVar6 >> ((byte)((byte)lVar23 | 0x10) & 0x1f) & 1) != 0) +
                              uVar5 * 2);
                }
                lVar23 = lVar23 + 1;
              } while (lVar23 != 5);
              if (vAdds->nSize <= (int)(uVar4 * 6 + 2)) goto LAB_0067f992;
              if (vAdds->pArray[(ulong)uVar4 * 6 + 2] == 0) {
                uVar9 = uVar4 * 6 + 5;
                if (vAdds->nSize <= (int)uVar9) {
LAB_0067f992:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                }
                if ((*(byte *)((long)vAdds->pArray + (ulong)uVar9 * 4 + 2) & 4) != 0) {
                  if (pVVar12->nSize <= lVar20) {
                    uVar9 = pVVar12->nSize * 2;
                    if ((int)uVar9 <= (int)uVar16) {
                      uVar9 = uVar16;
                    }
                    if (pVVar12->nCap < (int)uVar9) {
                      if (pVVar12->pArray == (Vec_Int_t *)0x0) {
                        pVVar15 = (Vec_Int_t *)malloc((ulong)uVar9 << 4);
                      }
                      else {
                        pVVar15 = (Vec_Int_t *)realloc(pVVar12->pArray,(ulong)uVar9 << 4);
                      }
                      pVVar12->pArray = pVVar15;
                      memset(pVVar15 + pVVar12->nCap,0,
                             ((long)(int)uVar9 - (long)pVVar12->nCap) * 0x10);
                      pVVar12->nCap = uVar9;
                    }
                    pVVar12->nSize = uVar16;
                  }
                  if (pVVar12->nSize <= lVar20) goto LAB_0067f9d0;
                  Vec_IntPush(pVVar12->pArray + lVar20,1);
                }
              }
              lVar21 = lVar21 + 1;
            } while (lVar21 < pVVar13[lVar20].nSize);
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 < vAddBoxes->nSize);
      }
      if (__s != (void *)0x0) {
        free(__s);
      }
      free(__s_00);
      lVar20 = (long)pVVar12->nSize;
      if ((0 < lVar20) && (lVar21 = (long)vXorLeaves->nSize, 0 < lVar21)) {
        pVVar13 = pVVar12->pArray;
        if ((pVVar13[lVar20 + -1].nSize == 0) &&
           ((pVVar15 = vXorLeaves->pArray, 0 < pVVar15[lVar21 + -1].nSize &&
            (0 < pVVar15[lVar21 + -1].nSize)))) {
          lVar23 = 0;
          do {
            if (pVVar15[lVar21 + -1].pArray[lVar23] < 0) goto LAB_0067fa0e;
            Vec_IntPush(pVVar13 + lVar20 + -1,pVVar15[lVar21 + -1].pArray[lVar23] * 2);
            lVar23 = lVar23 + 1;
          } while (lVar23 < pVVar15[lVar21 + -1].nSize);
        }
        lVar20 = (long)pVVar14->nSize;
        if (0 < lVar20) {
          if ((long)vXorRoots->nSize < 1) {
            __assert_fail("p->nSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
          }
          iVar2 = vXorRoots->pArray[(long)vXorRoots->nSize + -1];
          if (-1 < iVar2) {
            pVVar13 = pVVar14->pArray;
            if (pVVar13[lVar20 + -1].nCap < 1) {
              if (pVVar13[lVar20 + -1].pArray == (int *)0x0) {
                piVar10 = (int *)malloc(4);
              }
              else {
                piVar10 = (int *)realloc(pVVar13[lVar20 + -1].pArray,4);
              }
              pVVar13[lVar20 + -1].pArray = piVar10;
              if (piVar10 == (int *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
              pVVar13[lVar20 + -1].nCap = 1;
            }
            *pVVar13[lVar20 + -1].pArray = iVar2 * 2;
            pVVar13[lVar20 + -1].nSize = 1;
            if (0 < pVVar12->nSize) {
              lVar20 = 8;
              lVar21 = 0;
              do {
                qsort(*(void **)((long)&pVVar12->pArray->nCap + lVar20),
                      (long)*(int *)((long)pVVar12->pArray + lVar20 + -4),4,Vec_IntSortCompare1);
                lVar21 = lVar21 + 1;
                lVar20 = lVar20 + 0x10;
              } while (lVar21 < pVVar12->nSize);
            }
            if (0 < pVVar14->nSize) {
              lVar20 = 8;
              lVar21 = 0;
              do {
                qsort(*(void **)((long)&pVVar14->pArray->nCap + lVar20),
                      (long)*(int *)((long)pVVar14->pArray + lVar20 + -4),4,Vec_IntSortCompare2);
                lVar21 = lVar21 + 1;
                lVar20 = lVar20 + 0x10;
              } while (lVar21 < pVVar14->nSize);
            }
            return pAVar11;
          }
LAB_0067fa0e:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
      }
LAB_0067f9d0:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                    ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
LAB_0067f9ef:
    __assertion = "i >= 0 && i < p->nSize";
    __file = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h";
    __function = "void Vec_BitWriteEntry(Vec_Bit_t *, int, int)";
  }
  else {
    __assertion = "Vec_WecSize(vAddBoxes) == Vec_IntSize(vXorRoots)";
    __file = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecXor.c";
    __function = 
    "Acec_Box_t *Acec_FindBox(Gia_Man_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *)";
  }
  __assert_fail(__assertion,__file,0x132,__function);
}

Assistant:

Acec_Box_t * Acec_FindBox( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Wec_t * vAddBoxes, Vec_Wec_t * vXorLeaves, Vec_Int_t * vXorRoots )
{
    extern Vec_Int_t * Acec_TreeCarryMap( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Wec_t * vBoxes );
    extern void Acec_TreePhases_rec( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Int_t * vMap, int Node, int fPhase, Vec_Bit_t * vVisit );
    extern void Acec_TreeVerifyPhases( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Wec_t * vBoxes );
    extern void Acec_TreeVerifyPhases2( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Wec_t * vBoxes );

    int MaxRank = Vec_WecSize( vAddBoxes );
    Vec_Bit_t * vVisit  = Vec_BitStart( Vec_IntSize(vAdds)/6 );
    Vec_Bit_t * vIsLeaf = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Bit_t * vIsRoot = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Int_t * vLevel, * vLevel2, * vMap;
    int i, j, k, Box, Node;

    Acec_Box_t * pBox = ABC_CALLOC( Acec_Box_t, 1 );
    pBox->pGia        = p;
    pBox->vAdds       = vAddBoxes; // Vec_WecDup( vAddBoxes );
    pBox->vLeafLits   = Vec_WecStart( MaxRank + 0 );
    pBox->vRootLits   = Vec_WecStart( MaxRank + 0 );

    assert( Vec_WecSize(vAddBoxes) == Vec_WecSize(vXorLeaves) );
    assert( Vec_WecSize(vAddBoxes) == Vec_IntSize(vXorRoots) );

    // collect boxes; mark inputs/outputs
    Vec_WecForEachLevel( pBox->vAdds, vLevel, i )
    Vec_IntForEachEntry( vLevel, Box, k )
    {
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+0), 1 );
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+1), 1 );
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+2), 1 );
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+3), 1 );
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+4), 1 );
    }
    // sort each level
    Vec_WecForEachLevel( pBox->vAdds, vLevel, i )
        Vec_IntSort( vLevel, 0 );

    // set phases starting from roots
    vMap = Acec_TreeCarryMap( p, vAdds, pBox->vAdds );
    Vec_WecForEachLevelReverse( pBox->vAdds, vLevel, i )
        Vec_IntForEachEntry( vLevel, Box, k )
            if ( !Vec_BitEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+4) ) )
            {
                //printf( "Pushing phase of output %d of box %d\n", Vec_IntEntry(vAdds, 6*Box+4), Box );
                Acec_TreePhases_rec( p, vAdds, vMap, Vec_IntEntry(vAdds, 6*Box+4), Vec_IntEntry(vAdds, 6*Box+2) != 0, vVisit );
            }
    Acec_TreeVerifyPhases( p, vAdds, pBox->vAdds );
    Acec_TreeVerifyPhases2( p, vAdds, pBox->vAdds );
    Vec_BitFree( vVisit );
    Vec_IntFree( vMap );

    // collect inputs/outputs
    Vec_BitWriteEntry( vIsRoot, 0, 1 );
    Vec_WecForEachLevel( pBox->vAdds, vLevel, i )
        Vec_IntForEachEntry( vLevel, Box, j )
        {
            for ( k = 0; k < 3; k++ )
                if ( !Vec_BitEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+k) ) )
                    Vec_WecPush( pBox->vLeafLits, i, Abc_Var2Lit(Vec_IntEntry(vAdds, 6*Box+k), Acec_SignBit2(vAdds, Box, k)) );
            for ( k = 3; k < 5; k++ )
                if ( !Vec_BitEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+k) ) )
                    Vec_WecPush( pBox->vRootLits, k == 4 ? i + 1 : i, Abc_Var2Lit(Vec_IntEntry(vAdds, 6*Box+k), Acec_SignBit2(vAdds, Box, k)) );
            if ( Vec_IntEntry(vAdds, 6*Box+2) == 0 && Acec_SignBit2(vAdds, Box, 2) )
                Vec_WecPush( pBox->vLeafLits, i, 1 );
        }
    Vec_BitFree( vIsLeaf );
    Vec_BitFree( vIsRoot );

    // collect last bit
    vLevel  = Vec_WecEntry( pBox->vLeafLits, Vec_WecSize(pBox->vLeafLits)-1 );
    vLevel2 = Vec_WecEntry( vXorLeaves, Vec_WecSize(vXorLeaves)-1 );
    if ( Vec_IntSize(vLevel) == 0 && Vec_IntSize(vLevel2) > 0 )
    {
        Vec_IntForEachEntry( vLevel2, Node, k )
            Vec_IntPush( vLevel, Abc_Var2Lit(Node, 0) );
    }
    vLevel  = Vec_WecEntry( pBox->vRootLits, Vec_WecSize(pBox->vRootLits)-1 );
    Vec_IntFill( vLevel, 1, Abc_Var2Lit(Vec_IntEntryLast(vXorRoots), 0) );

    // sort each level
    Vec_WecForEachLevel( pBox->vLeafLits, vLevel, i )
        Vec_IntSort( vLevel, 0 );
    Vec_WecForEachLevel( pBox->vRootLits, vLevel, i )
        Vec_IntSort( vLevel, 1 );

    //Acec_CheckBoothPPs( p, pBox->vLeafLits );
    return pBox;
}